

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulatingstroker.cpp
# Opt level: O2

void __thiscall QTriangulatingStroker::endCap(QTriangulatingStroker *this,qreal *param_1)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  QVarLengthArray<float,_256LL> local_448;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(this + 100) == 0x20) {
    memset(&local_448.super_QVLAStorage<4UL,_4UL,_256LL>,0xaa,0x400);
    local_448.super_QVLABase<float>.super_QVLABaseBase.a = 0x100;
    local_448.super_QVLABase<float>.super_QVLABaseBase.s = 0;
    lVar4 = *(long *)(this + 0x10);
    lVar1 = *(long *)(this + 8) << 0x20;
    local_448.super_QVLABase<float>.super_QVLABaseBase.ptr =
         &local_448.super_QVLAStorage<4UL,_4UL,_256LL>;
    arcPoints(this,*(float *)(this + 0x18),*(float *)(this + 0x1c),
              *(float *)(lVar4 + (lVar1 + -0x200000000 >> 0x1e)),
              *(float *)(lVar4 + (lVar1 + -0x100000000 >> 0x1e)),
              *(float *)(lVar4 + (lVar1 + -0x400000000 >> 0x1e)),
              *(float *)(lVar4 + (lVar1 + -0x300000000 >> 0x1e)),&local_448);
    uVar3 = (ulong)(int)(local_448.super_QVLABase<float>.super_QVLABaseBase.s / 2);
    lVar4 = uVar3 * 8 + -4;
    lVar1 = 4;
    for (uVar2 = 0; uVar2 != (uVar3 & 0xffffffff); uVar2 = uVar2 + 1) {
      QDataBuffer<float>::add
                ((QDataBuffer<float> *)this,
                 (float *)((char *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr +
                          lVar4 + -4));
      QDataBuffer<float>::add
                ((QDataBuffer<float> *)this,
                 (float *)((char *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr + lVar4));
      if (uVar2 == (int)uVar3 - 1) break;
      QDataBuffer<float>::add
                ((QDataBuffer<float> *)this,
                 (float *)((char *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr +
                          lVar1 + -4));
      QDataBuffer<float>::add
                ((QDataBuffer<float> *)this,
                 (float *)((char *)local_448.super_QVLABase<float>.super_QVLABaseBase.ptr + lVar1));
      lVar4 = lVar4 + -8;
      lVar1 = lVar1 + 8;
      uVar3 = uVar3 - 1;
    }
    QVarLengthArray<float,_256LL>::~QVarLengthArray(&local_448);
  }
  else if (*(int *)(this + 100) == 0x10) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      emitLineSegment(this,*(float *)(this + 0x18) + *(float *)(this + 0x24),
                      *(float *)(this + 0x1c) - *(float *)(this + 0x20),*(float *)(this + 0x20),
                      *(float *)(this + 0x24));
      return;
    }
    goto LAB_003dee55;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_003dee55:
  __stack_chk_fail();
}

Assistant:

void QTriangulatingStroker::endCap(const qreal *)
{
    switch (m_cap_style) {
    case Qt::FlatCap:
        break;
    case Qt::SquareCap:
        emitLineSegment(m_cx + m_nvy, m_cy - m_nvx, m_nvx, m_nvy);
        break;
    case Qt::RoundCap: {
        QVarLengthArray<float> points;
        int count = m_vertices.size();
        arcPoints(m_cx, m_cy, m_vertices.at(count - 2), m_vertices.at(count - 1), m_vertices.at(count - 4), m_vertices.at(count - 3), points);
        int front = 0;
        int end = points.size() / 2;
        while (front != end) {
            m_vertices.add(points[2 * end - 2]);
            m_vertices.add(points[2 * end - 1]);
            --end;
            if (front == end)
                break;
            m_vertices.add(points[2 * front + 0]);
            m_vertices.add(points[2 * front + 1]);
            ++front;
        }
        break; }
    default: break; // to shut gcc up...
    }
}